

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_shard.c
# Opt level: O0

REF_STATUS ref_shard_prism_into_tet(REF_GRID ref_grid,REF_INT keeping_n_layers,REF_DICT of_faceid)

{
  REF_CELL ref_cell;
  REF_CELL ref_cell_00;
  REF_CELL ref_cell_01;
  REF_CELL ref_cell_02;
  REF_CELL ref_cell_03;
  REF_NODE ref_node_00;
  int iVar1;
  REF_INT RVar2;
  REF_INT RVar3;
  REF_STATUS RVar4;
  uint uVar5;
  REF_BOOL RVar6;
  REF_INT *vector;
  void *__ptr;
  int local_310;
  int local_30c;
  int local_308;
  int local_304;
  REF_GLOB local_300;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_STATUS ref_private_macro_code_rxs_1;
  REF_STATUS ref_private_macro_code_rxs;
  REF_INT ref_malloc_init_i_1;
  REF_INT ref_malloc_init_i;
  REF_INT *mark_copy;
  REF_INT *mark;
  REF_INT node;
  REF_INT relaxation;
  REF_NODE ref_node;
  REF_CELL tri;
  REF_CELL qua;
  REF_GLOB qua_global [27];
  int local_1a8 [2];
  REF_INT qua_nodes [27];
  REF_INT tri_nodes [27];
  REF_CELL tet;
  REF_CELL pyr;
  REF_CELL pri;
  REF_INT orig [27];
  int local_30;
  int local_2c;
  REF_INT tri_mark;
  REF_INT cell;
  REF_DICT of_faceid_local;
  REF_GRID pRStack_18;
  REF_INT keeping_n_layers_local;
  REF_GRID ref_grid_local;
  
  ref_cell = ref_grid->cell[10];
  ref_cell_00 = ref_grid->cell[9];
  ref_cell_01 = ref_grid->cell[8];
  ref_cell_02 = ref_grid->cell[6];
  ref_cell_03 = ref_grid->cell[3];
  ref_node_00 = ref_grid->node;
  _tri_mark = of_faceid;
  of_faceid_local._4_4_ = keeping_n_layers;
  pRStack_18 = ref_grid;
  if (ref_node_00->max < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x3a9,
           "ref_shard_prism_into_tet","malloc mark of REF_INT negative");
    ref_grid_local._4_4_ = 1;
  }
  else {
    vector = (REF_INT *)malloc((long)ref_node_00->max << 2);
    if (vector == (REF_INT *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x3a9
             ,"ref_shard_prism_into_tet","malloc mark of REF_INT NULL");
      ref_grid_local._4_4_ = 2;
    }
    else {
      for (ref_private_macro_code_rxs = 0; ref_private_macro_code_rxs < ref_node_00->max;
          ref_private_macro_code_rxs = ref_private_macro_code_rxs + 1) {
        vector[ref_private_macro_code_rxs] = -1;
      }
      if (ref_node_00->max < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
               0x3aa,"ref_shard_prism_into_tet","malloc mark_copy of REF_INT negative");
        ref_grid_local._4_4_ = 1;
      }
      else {
        __ptr = malloc((long)ref_node_00->max << 2);
        if (__ptr == (void *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
                 0x3aa,"ref_shard_prism_into_tet","malloc mark_copy of REF_INT NULL");
          ref_grid_local._4_4_ = 2;
        }
        else {
          for (ref_private_macro_code_rxs_1 = 0; ref_private_macro_code_rxs_1 < ref_node_00->max;
              ref_private_macro_code_rxs_1 = ref_private_macro_code_rxs_1 + 1) {
            *(undefined4 *)((long)__ptr + (long)ref_private_macro_code_rxs_1 * 4) = 0xffffffff;
          }
          if ((0 < of_faceid_local._4_4_) && (_tri_mark != (REF_DICT)0x0)) {
            for (local_2c = 0; local_2c < ref_cell->max; local_2c = local_2c + 1) {
              RVar4 = ref_cell_nodes(ref_cell,local_2c,(REF_INT *)&pri);
              RVar2 = orig[0];
              iVar1 = pri._4_4_;
              if (RVar4 == 0) {
                qua_nodes[0x1a] = (REF_INT)pri;
                uVar5 = ref_cell_with(ref_cell_03,qua_nodes + 0x1a,&local_30);
                if ((uVar5 != 0) && (uVar5 != 5)) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                         ,0x3b2,"ref_shard_prism_into_tet",(ulong)uVar5,"with");
                  return uVar5;
                }
                if ((local_30 != -1) &&
                   (RVar6 = ref_dict_has_key(_tri_mark,
                                             ref_cell_03->c2n[ref_cell_03->size_per * local_30 + 3])
                   , RVar6 != 0)) {
                  vector[qua_nodes[0x1a]] = 0;
                  vector[iVar1] = 0;
                  vector[RVar2] = 0;
                }
                RVar3 = orig[3];
                RVar2 = orig[2];
                qua_nodes[0x1a] = orig[1];
                uVar5 = ref_cell_with(ref_cell_03,qua_nodes + 0x1a,&local_30);
                if ((uVar5 != 0) && (uVar5 != 5)) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                         ,0x3bd,"ref_shard_prism_into_tet",(ulong)uVar5,"with");
                  return uVar5;
                }
                if ((local_30 != -1) &&
                   (RVar6 = ref_dict_has_key(_tri_mark,
                                             ref_cell_03->c2n[ref_cell_03->size_per * local_30 + 3])
                   , RVar6 != 0)) {
                  vector[qua_nodes[0x1a]] = 0;
                  vector[RVar3] = 0;
                  vector[RVar2] = 0;
                }
              }
            }
          }
          uVar5 = ref_node_ghost_int(ref_node_00,vector,1);
          if (uVar5 == 0) {
            for (mark._4_4_ = 0; mark._4_4_ < of_faceid_local._4_4_; mark._4_4_ = mark._4_4_ + 1) {
              for (mark._0_4_ = 0; (int)mark < ref_node_00->max; mark._0_4_ = (int)mark + 1) {
                *(REF_INT *)((long)__ptr + (long)(int)mark * 4) = vector[(int)mark];
              }
              for (local_2c = 0; local_2c < ref_cell->max; local_2c = local_2c + 1) {
                RVar4 = ref_cell_nodes(ref_cell,local_2c,(REF_INT *)&pri);
                if (RVar4 == 0) {
                  if ((*(int *)((long)__ptr + (long)(REF_INT)pri * 4) == -1) &&
                     (*(int *)((long)__ptr + (long)orig[1] * 4) != -1)) {
                    vector[(REF_INT)pri] = *(int *)((long)__ptr + (long)orig[1] * 4) + 1;
                  }
                  if ((*(int *)((long)__ptr + (long)orig[1] * 4) == -1) &&
                     (*(int *)((long)__ptr + (long)(REF_INT)pri * 4) != -1)) {
                    vector[orig[1]] = *(int *)((long)__ptr + (long)(REF_INT)pri * 4) + 1;
                  }
                  if ((*(int *)((long)__ptr + (long)pri._4_4_ * 4) == -1) &&
                     (*(int *)((long)__ptr + (long)orig[2] * 4) != -1)) {
                    vector[pri._4_4_] = *(int *)((long)__ptr + (long)orig[2] * 4) + 1;
                  }
                  if ((*(int *)((long)__ptr + (long)orig[2] * 4) == -1) &&
                     (*(int *)((long)__ptr + (long)pri._4_4_ * 4) != -1)) {
                    vector[orig[2]] = *(int *)((long)__ptr + (long)pri._4_4_ * 4) + 1;
                  }
                  if ((*(int *)((long)__ptr + (long)orig[0] * 4) == -1) &&
                     (*(int *)((long)__ptr + (long)orig[3] * 4) != -1)) {
                    vector[orig[0]] = *(int *)((long)__ptr + (long)orig[3] * 4) + 1;
                  }
                  if ((*(int *)((long)__ptr + (long)orig[3] * 4) == -1) &&
                     (*(int *)((long)__ptr + (long)orig[0] * 4) != -1)) {
                    vector[orig[3]] = *(int *)((long)__ptr + (long)orig[0] * 4) + 1;
                  }
                }
              }
              uVar5 = ref_node_ghost_int(ref_node_00,vector,1);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                       ,0x3db,"ref_shard_prism_into_tet",(ulong)uVar5,"update ghost mark");
                return uVar5;
              }
            }
            for (local_2c = 0; local_2c < ref_cell->max; local_2c = local_2c + 1) {
              RVar4 = ref_cell_nodes(ref_cell,local_2c,(REF_INT *)&pri);
              if ((RVar4 == 0) && ((vector[(REF_INT)pri] == -1 || (vector[orig[1]] == -1)))) {
                uVar5 = ref_cell_remove(ref_cell,local_2c);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                         ,0x3e1,"ref_shard_prism_into_tet",(ulong)uVar5,"remove pri");
                  return uVar5;
                }
                uVar5 = ref_shard_add_pri_as_tet(ref_node_00,ref_cell_01,(REF_INT *)&pri,1);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                         ,0x3e3,"ref_shard_prism_into_tet",(ulong)uVar5,"converts to tets");
                  return uVar5;
                }
              }
            }
            for (local_2c = 0; local_2c < ref_cell_00->max; local_2c = local_2c + 1) {
              RVar4 = ref_cell_nodes(ref_cell_00,local_2c,(REF_INT *)&pri);
              if ((RVar4 == 0) &&
                 ((((vector[(REF_INT)pri] == -1 || (vector[pri._4_4_] == -1)) ||
                   (vector[orig[1]] == -1)) || (vector[orig[2]] == -1)))) {
                uVar5 = ref_cell_remove(ref_cell_00,local_2c);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                         ,0x3eb,"ref_shard_prism_into_tet",(ulong)uVar5,"remove qua");
                  return uVar5;
                }
                uVar5 = ref_shard_add_pyr_as_tet(ref_node_00,ref_cell_01,(REF_INT *)&pri,1);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                         ,0x3ed,"ref_shard_prism_into_tet",(ulong)uVar5,"converts to tets");
                  return uVar5;
                }
              }
            }
            for (local_2c = 0; local_2c < ref_cell_02->max; local_2c = local_2c + 1) {
              RVar4 = ref_cell_nodes(ref_cell_02,local_2c,local_1a8);
              if ((RVar4 == 0) &&
                 (((vector[local_1a8[0]] == -1 || (vector[local_1a8[1]] == -1)) ||
                  ((vector[qua_nodes[0]] == -1 || (vector[qua_nodes[1]] == -1)))))) {
                uVar5 = ref_cell_remove(ref_cell_02,local_2c);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                         ,0x3f5,"ref_shard_prism_into_tet",(ulong)uVar5,"remove qua");
                  return uVar5;
                }
                for (mark._0_4_ = 0; (int)mark < ref_cell_02->node_per; mark._0_4_ = (int)mark + 1)
                {
                  if (((local_1a8[(int)mark] < 0) || (ref_node_00->max <= local_1a8[(int)mark])) ||
                     (ref_node_00->global[local_1a8[(int)mark]] < 0)) {
                    local_300 = -1;
                  }
                  else {
                    local_300 = ref_node_00->global[local_1a8[(int)mark]];
                  }
                  qua_global[(long)(int)mark + -1] = local_300;
                }
                if ((((long)qua < qua_global[0]) && ((long)qua < qua_global[2])) ||
                   ((qua_global[1] < qua_global[0] && (qua_global[1] < qua_global[2])))) {
                  qua_nodes[0x1a] = local_1a8[0];
                  uVar5 = ref_shard_cell_add_local(ref_node_00,ref_cell_03,qua_nodes + 0x1a);
                  if (uVar5 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                           ,0x404,"ref_shard_prism_into_tet",(ulong)uVar5,"a tri");
                    return uVar5;
                  }
                  qua_nodes[0x1a] = local_1a8[0];
                  uVar5 = ref_shard_cell_add_local(ref_node_00,ref_cell_03,qua_nodes + 0x1a);
                  if (uVar5 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                           ,0x408,"ref_shard_prism_into_tet",(ulong)uVar5,"a tri");
                    return uVar5;
                  }
                }
                else {
                  qua_nodes[0x1a] = local_1a8[0];
                  uVar5 = ref_shard_cell_add_local(ref_node_00,ref_cell_03,qua_nodes + 0x1a);
                  if (uVar5 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                           ,0x410,"ref_shard_prism_into_tet",(ulong)uVar5,"a tri");
                    return uVar5;
                  }
                  qua_nodes[0x1a] = qua_nodes[0];
                  uVar5 = ref_shard_cell_add_local(ref_node_00,ref_cell_03,qua_nodes + 0x1a);
                  if (uVar5 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                           ,0x414,"ref_shard_prism_into_tet",(ulong)uVar5,"a tri");
                    return uVar5;
                  }
                }
              }
            }
            if (__ptr != (void *)0x0) {
              free(__ptr);
            }
            if (vector != (REF_INT *)0x0) {
              free(vector);
            }
            for (mark._0_4_ = 0; (int)mark < ref_node_00->max; mark._0_4_ = (int)mark + 1) {
              if (((-1 < (int)mark) && ((int)mark < ref_node_00->max)) &&
                 (-1 < ref_node_00->global[(int)mark])) {
                if (((int)mark < 0) || (pRStack_18->cell[8]->ref_adj->nnode <= (int)mark)) {
                  local_304 = -1;
                }
                else {
                  local_304 = pRStack_18->cell[8]->ref_adj->first[(int)mark];
                }
                if (local_304 == -1) {
                  if (((int)mark < 0) || (pRStack_18->cell[9]->ref_adj->nnode <= (int)mark)) {
                    local_308 = -1;
                  }
                  else {
                    local_308 = pRStack_18->cell[9]->ref_adj->first[(int)mark];
                  }
                  if (local_308 == -1) {
                    if (((int)mark < 0) || (pRStack_18->cell[10]->ref_adj->nnode <= (int)mark)) {
                      local_30c = -1;
                    }
                    else {
                      local_30c = pRStack_18->cell[10]->ref_adj->first[(int)mark];
                    }
                    if (local_30c == -1) {
                      if (((int)mark < 0) || (pRStack_18->cell[0xb]->ref_adj->nnode <= (int)mark)) {
                        local_310 = -1;
                      }
                      else {
                        local_310 = pRStack_18->cell[0xb]->ref_adj->first[(int)mark];
                      }
                      if ((local_310 == -1) &&
                         (uVar5 = ref_node_remove_without_global(ref_node_00,(int)mark), uVar5 != 0)
                         ) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                               ,0x420,"ref_shard_prism_into_tet",(ulong)uVar5,"hang node");
                        return uVar5;
                      }
                    }
                  }
                }
              }
            }
            ref_grid_local._4_4_ = 0;
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                   ,0x3c6,"ref_shard_prism_into_tet",(ulong)uVar5,"update ghost mark");
            ref_grid_local._4_4_ = uVar5;
          }
        }
      }
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_shard_prism_into_tet(REF_GRID ref_grid,
                                            REF_INT keeping_n_layers,
                                            REF_DICT of_faceid) {
  REF_INT cell, tri_mark;

  REF_INT orig[REF_CELL_MAX_SIZE_PER];
  REF_CELL pri = ref_grid_pri(ref_grid);
  REF_CELL pyr = ref_grid_pyr(ref_grid);
  REF_CELL tet = ref_grid_tet(ref_grid);

  REF_INT tri_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT qua_nodes[REF_CELL_MAX_SIZE_PER];
  REF_GLOB qua_global[REF_CELL_MAX_SIZE_PER];
  REF_CELL qua = ref_grid_qua(ref_grid);
  REF_CELL tri = ref_grid_tri(ref_grid);

  REF_NODE ref_node = ref_grid_node(ref_grid);

  REF_INT relaxation;
  REF_INT node;
  REF_INT *mark, *mark_copy;

  ref_malloc_init(mark, ref_node_max(ref_node), REF_INT, REF_EMPTY);
  ref_malloc_init(mark_copy, ref_node_max(ref_node), REF_INT, REF_EMPTY);

  /* mark nodes on prism tris */
  if (0 < keeping_n_layers && NULL != of_faceid)
    each_ref_cell_valid_cell_with_nodes(pri, cell, orig) {
      tri_nodes[0] = orig[0];
      tri_nodes[1] = orig[1];
      tri_nodes[2] = orig[2];
      RXS(ref_cell_with(tri, tri_nodes, &tri_mark), REF_NOT_FOUND, "with");
      if (REF_EMPTY != tri_mark) {
        if (ref_dict_has_key(of_faceid, ref_cell_c2n(tri, 3, tri_mark))) {
          mark[tri_nodes[0]] = 0;
          mark[tri_nodes[1]] = 0;
          mark[tri_nodes[2]] = 0;
        }
      }
      tri_nodes[0] = orig[3];
      tri_nodes[1] = orig[5];
      tri_nodes[2] = orig[4];
      RXS(ref_cell_with(tri, tri_nodes, &tri_mark), REF_NOT_FOUND, "with");
      if (REF_EMPTY != tri_mark) {
        if (ref_dict_has_key(of_faceid, ref_cell_c2n(tri, 3, tri_mark))) {
          mark[tri_nodes[0]] = 0;
          mark[tri_nodes[1]] = 0;
          mark[tri_nodes[2]] = 0;
        }
      }
    }
  RSS(ref_node_ghost_int(ref_node, mark, 1), "update ghost mark");

  for (relaxation = 0; relaxation < keeping_n_layers; relaxation++) {
    for (node = 0; node < ref_node_max(ref_node); node++)
      mark_copy[node] = mark[node];
    each_ref_cell_valid_cell_with_nodes(pri, cell, orig) {
      if (mark_copy[orig[0]] == REF_EMPTY && mark_copy[orig[3]] != REF_EMPTY)
        mark[orig[0]] = mark_copy[orig[3]] + 1;
      if (mark_copy[orig[3]] == REF_EMPTY && mark_copy[orig[0]] != REF_EMPTY)
        mark[orig[3]] = mark_copy[orig[0]] + 1;

      if (mark_copy[orig[1]] == REF_EMPTY && mark_copy[orig[4]] != REF_EMPTY)
        mark[orig[1]] = mark_copy[orig[4]] + 1;
      if (mark_copy[orig[4]] == REF_EMPTY && mark_copy[orig[1]] != REF_EMPTY)
        mark[orig[4]] = mark_copy[orig[1]] + 1;

      if (mark_copy[orig[2]] == REF_EMPTY && mark_copy[orig[5]] != REF_EMPTY)
        mark[orig[2]] = mark_copy[orig[5]] + 1;
      if (mark_copy[orig[5]] == REF_EMPTY && mark_copy[orig[2]] != REF_EMPTY)
        mark[orig[5]] = mark_copy[orig[2]] + 1;
    }
    RSS(ref_node_ghost_int(ref_node, mark, 1), "update ghost mark");
  }

  each_ref_cell_valid_cell_with_nodes(pri, cell, orig) {
    if (mark[orig[0]] != REF_EMPTY && mark[orig[3]] != REF_EMPTY) continue;

    RSS(ref_cell_remove(pri, cell), "remove pri");
    RSS(ref_shard_add_pri_as_tet(ref_node, tet, orig, REF_TRUE),
        "converts to tets");
  }

  each_ref_cell_valid_cell_with_nodes(pyr, cell, orig) {
    if (mark[orig[0]] != REF_EMPTY && mark[orig[1]] != REF_EMPTY &&
        mark[orig[3]] != REF_EMPTY && mark[orig[4]] != REF_EMPTY)
      continue;

    RSS(ref_cell_remove(pyr, cell), "remove qua");
    RSS(ref_shard_add_pyr_as_tet(ref_node, tet, orig, REF_TRUE),
        "converts to tets");
  }

  each_ref_cell_valid_cell_with_nodes(qua, cell, qua_nodes) {
    if (mark[qua_nodes[0]] != REF_EMPTY && mark[qua_nodes[1]] != REF_EMPTY &&
        mark[qua_nodes[2]] != REF_EMPTY && mark[qua_nodes[3]] != REF_EMPTY)
      continue;

    RSS(ref_cell_remove(qua, cell), "remove qua");
    tri_nodes[3] = qua_nodes[4]; /* patch id */

    for (node = 0; node < ref_cell_node_per(qua); node++)
      qua_global[node] = ref_node_global(ref_node, qua_nodes[node]);

    if ((qua_global[0] < qua_global[1] && qua_global[0] < qua_global[3]) ||
        (qua_global[2] < qua_global[1] &&
         qua_global[2] < qua_global[3])) { /* 0-2 diag split of quad */
                                           /* 2-1
                                              |\|
                                              3-0 */
      tri_nodes[0] = qua_nodes[0];
      tri_nodes[1] = qua_nodes[2];
      tri_nodes[2] = qua_nodes[3];
      RSS(ref_shard_cell_add_local(ref_node, tri, tri_nodes), "a tri");
      tri_nodes[0] = qua_nodes[0];
      tri_nodes[1] = qua_nodes[1];
      tri_nodes[2] = qua_nodes[2];
      RSS(ref_shard_cell_add_local(ref_node, tri, tri_nodes), "a tri");
    } else { /* 3-1 diag split of quad */
             /* 2-1
                |/|
                3-0 */
      tri_nodes[0] = qua_nodes[0];
      tri_nodes[1] = qua_nodes[1];
      tri_nodes[2] = qua_nodes[3];
      RSS(ref_shard_cell_add_local(ref_node, tri, tri_nodes), "a tri");
      tri_nodes[0] = qua_nodes[2];
      tri_nodes[1] = qua_nodes[3];
      tri_nodes[2] = qua_nodes[1];
      RSS(ref_shard_cell_add_local(ref_node, tri, tri_nodes), "a tri");
    }
  }

  ref_free(mark_copy);
  ref_free(mark);

  each_ref_node_valid_node(ref_node, node) {
    if (ref_adj_empty(ref_cell_adj(ref_grid_tet(ref_grid)), node) &&
        ref_adj_empty(ref_cell_adj(ref_grid_pyr(ref_grid)), node) &&
        ref_adj_empty(ref_cell_adj(ref_grid_pri(ref_grid)), node) &&
        ref_adj_empty(ref_cell_adj(ref_grid_hex(ref_grid)), node)) {
      RSS(ref_node_remove_without_global(ref_node, node), "hang node");
    }
  }

  return REF_SUCCESS;
}